

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
at<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,int index)

{
  LogMessage *pLVar1;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (index < 0) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6ac);
    pLVar1 = LogMessage::operator<<(&local_60,"CHECK failed: (index) >= (0): ");
    LogFinisher::operator=(&local_21,pLVar1);
    LogMessage::~LogMessage(&local_60);
  }
  if (this->current_size_ <= index) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/repeated_field.h"
               ,0x6ad);
    pLVar1 = LogMessage::operator<<(&local_60,"CHECK failed: (index) < (current_size_): ");
    LogFinisher::operator=(&local_21,pLVar1);
    LogMessage::~LogMessage(&local_60);
  }
  return (Type *)this->rep_->elements[index];
}

Assistant:

inline typename TypeHandler::Type& RepeatedPtrFieldBase::at(int index) {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return *cast<TypeHandler>(rep_->elements[index]);
}